

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluent_builder.cpp
# Opt level: O2

HtmlBuilder * HtmlElement::build(HtmlBuilder *__return_storage_ptr__,string *name)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)name);
  HtmlBuilder::HtmlBuilder(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

HtmlBuilder HtmlElement::build(std::string name)
{
	return HtmlBuilder(std::move(name));
}